

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O2

size_t __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::improvePartitions(PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
                    *this)

{
  PartitionGraph *this_00;
  vector<bool,_std::allocator<bool>_> *this_01;
  vector<bool,_std::allocator<bool>_> *this_02;
  pointer puVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bvector_impl *p_Var4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  size_t sVar8;
  ulong *puVar9;
  pointer pVVar10;
  pointer pVVar11;
  size_t idx;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  pointer pAVar16;
  reference rVar17;
  reference rVar18;
  _Bit_const_iterator __first;
  _Bit_const_iterator __last;
  size_t local_78;
  reference local_50;
  reference local_40;
  
  this_00 = &this->partitionGraph_;
  this_01 = &this->changed_;
  this_02 = &this->needsUpdate_;
  for (uVar12 = 0;
      uVar12 < (ulong)((long)(this->partitionGraph_).
                             super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
                             vertices_.
                             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->partitionGraph_).
                             super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
                             vertices_.
                             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 6); uVar12 = uVar12 + 1) {
    local_40 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,uVar12);
    local_50 = std::vector<bool,_std::allocator<bool>_>::operator[](this_02,uVar12);
    std::_Bit_reference::operator=(&local_50,&local_40);
    rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,uVar12);
    *rVar17._M_p = *rVar17._M_p & ~rVar17._M_mask;
  }
  p_Var4 = &(this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar2 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar3 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar3;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  iVar5 = std::accumulate<std::_Bit_const_iterator,int>(__first,__last,0);
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0xf;
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  pVVar11 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
            vertices_.
            super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar10 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
            vertices_.
            super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar15 = 0x50;
  local_78 = 0;
  uVar12 = 0;
  while (uVar12 < ((long)pVVar10 - (long)pVVar11 >> 6) - 1U) {
    uVar13 = uVar12 + 1;
    lVar14 = lVar15;
    while ((uVar13 < (ulong)((long)pVVar10 - (long)pVVar11 >> 6) &&
           (puVar1 = (this->partitionGraph_).partitions_.
                     super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           puVar1[uVar12]._M_h._M_element_count != 0))) {
      if ((*(long *)((long)&(puVar1->_M_h)._M_buckets + lVar14) != 0) &&
         ((rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_02,uVar12),
          (*rVar17._M_p & rVar17._M_mask) != 0 ||
          (rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_02,uVar13),
          (*rVar17._M_p & rVar17._M_mask) != 0)))) {
        sVar7 = PartitionGraph::frameOfPartition(this_00,uVar12);
        sVar8 = PartitionGraph::frameOfPartition(this_00,uVar13);
        if ((sVar7 == sVar8) && (sVar7 = improveBipartition(this,uVar12,uVar13), sVar7 != 0)) {
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,uVar12);
          *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,uVar13);
          *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
          local_78 = local_78 + sVar7;
          HeuristicBase::logObj(&this->super_HeuristicBase);
        }
      }
      uVar13 = uVar13 + 1;
      pVVar11 = (this->partitionGraph_).
                super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar10 = (this->partitionGraph_).
                super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar14 = lVar14 + 0x38;
    }
    lVar15 = lVar15 + 0x38;
    uVar12 = uVar12 + 1;
  }
  for (uVar12 = 0; uVar12 < (ulong)((long)pVVar10 - (long)pVVar11 >> 6); uVar12 = uVar12 + 1) {
    rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_02,uVar12);
    if (((*rVar17._M_p & rVar17._M_mask) != 0) && (sVar7 = splitPartition(this,uVar12), sVar7 != 0))
    {
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,uVar12);
      *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
      local_78 = local_78 + sVar7;
      HeuristicBase::logObj(&this->super_HeuristicBase);
    }
    pVVar11 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>
              .vertices_.
              super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pVVar10 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>
              .vertices_.
              super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (uVar12 = 0; uVar12 < (ulong)((long)pVVar10 - (long)pVVar11 >> 6); uVar12 = uVar12 + 1) {
    rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,uVar12);
    uVar13 = *rVar17._M_p;
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[](this_02,uVar12);
    puVar9 = rVar18._M_p;
    if ((uVar13 & rVar17._M_mask) == 0) {
      uVar13 = ~rVar18._M_mask & *puVar9;
    }
    else {
      uVar13 = rVar18._M_mask | *puVar9;
    }
    *puVar9 = uVar13;
    pVVar11 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>
              .vertices_.
              super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pVVar10 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>
              .vertices_.
              super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (uVar12 = 0; uVar12 < (ulong)((long)pVVar10 - (long)pVVar11 >> 6); uVar12 = uVar12 + 1) {
    rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,uVar12);
    if ((*rVar17._M_p & rVar17._M_mask) == 0) {
      pVVar11 = (this_00->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
                super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_02,uVar12);
      pVVar11 = (this_00->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
                super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((*rVar17._M_p & rVar17._M_mask) != 0) {
        for (pAVar16 = *(pointer *)&((Adjacencies *)((long)(pVVar11 + uVar12) + 0x20))->vector_;
            pAVar16 != *(pointer *)((long)(pVVar11 + uVar12) + 0x28); pAVar16 = pAVar16 + 1) {
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,pAVar16->vertex_);
          *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
          pVVar11 = (this_00->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                    vertices_.
                    super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        for (pAVar16 = *(pointer *)&pVVar11[uVar12].from_;
            pAVar16 != *(pointer *)((long)(pVVar11 + uVar12) + 8); pAVar16 = pAVar16 + 1) {
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,pAVar16->vertex_);
          *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
          pVVar11 = (this_00->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                    vertices_.
                    super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
      }
    }
    pVVar10 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>
              .vertices_.
              super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  return local_78;
}

Assistant:

inline size_t
PartitionOptimizerBase<BROPT>::improvePartitions()
{
    size_t numberOfMoves = 0;

    // update "dirty" flags.
    for (size_t idx = 0; idx < partitionGraph_.numberOfVertices(); ++idx) {
        needsUpdate_[idx] = changed_[idx];
        changed_[idx] = false;
    }

    {
        // complete info line.
        const auto numberOfUpdatedCells =
            std::accumulate(needsUpdate_.cbegin(), needsUpdate_.cend(), 0);
        std::cout << std::setw(WIDTH) << numberOfUpdatedCells << std::endl;
    }

    for (size_t partitionA = 0;
         partitionA < partitionGraph_.numberOfVertices() - 1; ++partitionA) {

        for (size_t partitionB = partitionA + 1;
             partitionB < partitionGraph_.numberOfVertices(); ++partitionB) {

            if (partitionGraph_.partitions_[partitionA].empty())
                break;
            if (partitionGraph_.partitions_[partitionB].empty())
                continue;

            // check if "dirty"
            if (!needsUpdate_[partitionA] && !needsUpdate_[partitionB]) {
                continue;
            }

            // check whether the partitions are in the same frame.
            // proximity (i.e. presence of an edge between them) will be
            // tested
            // implicitly in improveBipartition.
            if (partitionGraph_.frameOfPartition(partitionA) !=
                partitionGraph_.frameOfPartition(partitionB)) {
                continue;
            }

            const auto additionalMoves =
                improveBipartition(partitionA, partitionB);

            if (additionalMoves > 0) {
                changed_[partitionA] = true;
                changed_[partitionB] = true;
                numberOfMoves += additionalMoves;

                this->logObj();
            }
        }
    }

    // introduce new partitions.
    for (size_t partitionA = 0; partitionA < partitionGraph_.numberOfVertices();
         ++partitionA) {
        if (!needsUpdate_[partitionA]) {
            continue;
        }

        const auto additionalMoves = splitPartition(partitionA);

        if (additionalMoves > 0) {
            changed_[partitionA] = true;
            numberOfMoves += additionalMoves;

            this->logObj();
        }
    }

    // propagate "changed" flags along branching edges.
    // First, transfer flags to needsUpdate_ to prevent propagation
    // in the entire connected component.
    for (size_t partition = 0; partition < partitionGraph_.numberOfVertices();
         ++partition) {
        if (changed_[partition]) {
            needsUpdate_[partition] = true;
        } else {
            needsUpdate_[partition] = false;
        }
    }

    for (size_t partition = 0; partition < partitionGraph_.numberOfVertices();
         ++partition) {
        if (changed_[partition] && needsUpdate_[partition]) {

            for (auto it = partitionGraph_.verticesFromVertexBegin(partition);
                 it != partitionGraph_.verticesFromVertexEnd(partition); ++it) {
                changed_[*it] = true;
            }

            for (auto it = partitionGraph_.verticesToVertexBegin(partition);
                 it != partitionGraph_.verticesToVertexEnd(partition); ++it) {
                changed_[*it] = true;
            }
        }
    }

    return numberOfMoves;
}